

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O1

glslopt_shader *
glslopt_optimize(glslopt_ctx *ctx,glslopt_shader_type type,char *shaderSource,uint options)

{
  gl_shader *pgVar1;
  gl_shader_program *prog;
  exec_node *peVar2;
  exec_node *peVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  GLenum16 GVar20;
  int iVar21;
  glslopt_shader *this;
  _mesa_glsl_parse_state *this_00;
  exec_list *instructions;
  char *pcVar22;
  loop_state *ls;
  gl_shader_stage gVar23;
  byte bVar24;
  long lVar25;
  PrintGlslMode mode;
  char *local_40;
  gl_linked_shader *local_38;
  
  local_40 = shaderSource;
  this = (glslopt_shader *)glslopt_shader::operator_new(0xa050,ctx->mem_ctx);
  glslopt_shader::glslopt_shader(this);
  mode = kPrintGlslVertex;
  if (type == kGlslOptShaderVertex) {
    GVar20 = 0x8b31;
    gVar23 = MESA_SHADER_VERTEX;
    mode = kPrintGlslVertex;
  }
  else {
    if (type != kGlslOptShaderFragment) goto LAB_0014ea67;
    gVar23 = MESA_SHADER_FRAGMENT;
    GVar20 = 0x8b30;
    mode = kPrintGlslFragment;
  }
  pgVar1 = this->shader;
  pgVar1->Type = GVar20;
  pgVar1->Stage = gVar23;
LAB_0014ea67:
  if (this->shader->Type == 0) {
    pcVar22 = ralloc_asprintf(this,"Unknown shader type %d",type);
    this->infoLog = pcVar22;
    this->status = false;
  }
  else {
    this_00 = (_mesa_glsl_parse_state *)_mesa_glsl_parse_state::operator_new(0x588,this);
    _mesa_glsl_parse_state::_mesa_glsl_parse_state(this_00,&ctx->mesa_ctx,this->shader->Stage,this);
    this_00->error = false;
    if ((options & 1) == 0) {
      iVar21 = glcpp_preprocess(this_00,&local_40,&this_00->info_log,add_builtin_defines,this_00,
                                &ctx->mesa_ctx);
      this_00->error = iVar21 != 0;
      if (iVar21 != 0) {
        this->status = false;
        this->infoLog = this_00->info_log;
        return this;
      }
    }
    _mesa_glsl_lexer_ctor(this_00,local_40);
    _mesa_glsl_parse(this_00);
    _mesa_glsl_lexer_dtor(this_00);
    instructions = (exec_list *)exec_list::operator_new(0x20,this);
    (instructions->head_sentinel).next = (exec_node *)0x0;
    (instructions->head_sentinel).prev = (exec_node *)0x0;
    (instructions->tail_sentinel).next = (exec_node *)0x0;
    (instructions->tail_sentinel).prev = (exec_node *)0x0;
    (instructions->head_sentinel).next = &instructions->tail_sentinel;
    (instructions->head_sentinel).prev = (exec_node *)0x0;
    (instructions->tail_sentinel).next = (exec_node *)0x0;
    (instructions->tail_sentinel).prev = (exec_node *)instructions;
    this->shader->ir = instructions;
    if ((this_00->error == false) &&
       ((this_00->translation_unit).head_sentinel.next != &(this_00->translation_unit).tail_sentinel
       )) {
      _mesa_ast_to_hir(instructions,this_00);
    }
    if (this_00->error == false) {
      validate_ir_tree(instructions);
      pcVar22 = ralloc_strdup(this,"");
      pcVar22 = _mesa_print_ir_glsl(instructions,this_00,pcVar22,mode);
      this->rawOutput = pcVar22;
    }
    lower_builtins(instructions);
    this->shader->symbols = this_00->symbols;
    if (this_00->error == false) {
      local_38 = (gl_linked_shader *)0x0;
      if (((options & 2) == 0) &&
         ((instructions->head_sentinel).next != &instructions->tail_sentinel)) {
        prog = this->whole_program;
        local_38 = link_intrastage_shaders
                             (this,&ctx->mesa_ctx,prog,prog->Shaders,prog->NumShaders,true);
        if (local_38 == (gl_linked_shader *)0x0) {
          this->status = false;
          this->infoLog = this->whole_program->data->InfoLog;
          return this;
        }
        instructions = local_38->ir;
      }
    }
    else {
      local_38 = (gl_linked_shader *)0x0;
    }
    if ((this_00->error == false) &&
       ((instructions->head_sentinel).next != &instructions->tail_sentinel)) {
      uVar4 = 0;
      do {
        if ((options & 2) == 0) {
          bVar5 = do_function_inlining(instructions);
          bVar6 = do_dead_functions(instructions);
          bVar7 = do_structure_splitting(instructions);
          bVar7 = bVar7 || (bVar6 || bVar5);
        }
        else {
          bVar7 = false;
        }
        bVar5 = do_if_simplification(instructions);
        bVar6 = opt_flatten_nested_if_blocks(instructions);
        bVar8 = do_copy_propagation_elements(instructions);
        bVar24 = (bVar8 || bVar6) | bVar5 | bVar7;
        if ((options & 2) == 0) {
          bVar7 = do_vectorize(instructions);
          bVar24 = bVar24 | bVar7;
        }
        if ((options & 2) == 0) {
          bVar7 = do_dead_code(instructions,false);
        }
        else {
          bVar7 = do_dead_code_unlinked(instructions);
        }
        bVar5 = do_dead_code_local(instructions);
        bVar6 = do_tree_grafting(instructions);
        bVar8 = do_constant_propagation(instructions);
        if ((options & 2) == 0) {
          bVar9 = do_constant_variable(instructions);
        }
        else {
          bVar9 = do_constant_variable_unlinked(instructions);
        }
        bVar10 = do_constant_folding(instructions);
        bVar11 = do_minmax_prune(instructions);
        bVar12 = do_rebalance_tree(instructions);
        bVar13 = do_algebraic(instructions,(this_00->ctx->Const).NativeIntegers != '\0',
                              (this_00->ctx->Const).ShaderCompilerOptions + this_00->stage);
        bVar14 = do_lower_jumps(instructions,true,true,false,false,false);
        bVar15 = do_vec_index_to_swizzle(instructions);
        bVar16 = lower_vector_insert(instructions,false);
        bVar17 = optimize_swizzles(instructions);
        bVar18 = optimize_split_arrays(instructions,(options & 2) == 0);
        bVar19 = optimize_redundant_jumps(instructions);
        bVar24 = bVar19 | bVar18 | bVar17 | bVar16 | bVar15 | bVar14 | (bVar12 || (bVar11 || bVar10)
                                                                       ) | bVar8 | bVar6 | bVar5 | 
                                                  bVar9 | bVar24 | bVar7 | bVar13;
        if ((options & 2) == 0) {
          ls = analyze_loop_variables(instructions);
          if (ls->loop_found == true) {
            bVar7 = unroll_loops(instructions,ls,
                                 (this_00->ctx->Const).ShaderCompilerOptions + this_00->stage);
            bVar24 = bVar24 | bVar7;
          }
          loop_state::~loop_state(ls);
          operator_delete(ls);
        }
      } while ((bVar24 != 0) && (bVar7 = uVar4 < 999, uVar4 = uVar4 + 1, bVar7));
      lower_instructions(instructions,0x400);
      validate_ir_tree(instructions);
    }
    if (this_00->error == false) {
      pcVar22 = ralloc_strdup(this,"");
      pcVar22 = _mesa_print_ir_glsl(instructions,this_00,pcVar22,mode);
      this->optimizedOutput = pcVar22;
    }
    this->status = (bool)(this_00->error ^ 1);
    this->infoLog = this_00->info_log;
    peVar2 = (instructions->head_sentinel).next;
    peVar3 = peVar2->next;
    while (peVar3 != (exec_node *)0x0) {
      if (*(int *)&peVar2[1].next == 7) {
        if (((ulong)peVar2[3].prev & 0xf000) == 0x4000) {
          lVar25 = (long)this->inputCount;
          if (0x7f < lVar25) goto LAB_0014f020;
          pcVar22 = ralloc_strdup(this,(char *)peVar2[2].next);
          this->inputs[lVar25].name = pcVar22;
          iVar21 = -1;
          if (((ulong)peVar2[3].prev & 0x40000) != 0) {
            iVar21 = *(int *)&peVar2[4].prev;
          }
          this->inputs[lVar25].location = iVar21;
          this->inputCount = this->inputCount + 1;
        }
        if ((((ulong)peVar2[3].prev & 0xf000) == 0x1000) &&
           (*(char *)((long)&(peVar2[1].prev)->next + 4) != '\f')) {
          lVar25 = (long)this->uniformCount;
          if (0x3ff < lVar25) goto LAB_0014f020;
          pcVar22 = ralloc_strdup(this,(char *)peVar2[2].next);
          this->uniforms[lVar25].name = pcVar22;
          iVar21 = -1;
          if (((ulong)peVar2[3].prev & 0x40000) != 0) {
            iVar21 = *(int *)&peVar2[4].prev;
          }
          this->uniforms[lVar25].location = iVar21;
          this->uniformCount = this->uniformCount + 1;
        }
        if (((((ulong)peVar2[3].prev & 0xf000) == 0x1000) &&
            (*(char *)((long)&(peVar2[1].prev)->next + 4) == '\f')) &&
           (lVar25 = (long)this->textureCount, lVar25 < 0x80)) {
          pcVar22 = ralloc_strdup(this,(char *)peVar2[2].next);
          this->textures[lVar25].name = pcVar22;
          iVar21 = -1;
          if (((ulong)peVar2[3].prev & 0x40000) != 0) {
            iVar21 = *(int *)&peVar2[4].prev;
          }
          this->textures[lVar25].location = iVar21;
          this->textureCount = this->textureCount + 1;
        }
      }
LAB_0014f020:
      peVar2 = peVar2->next;
      peVar3 = peVar2->next;
    }
    ralloc_free(instructions);
    ralloc_free(this_00);
    if (local_38 != (gl_linked_shader *)0x0) {
      ralloc_free(local_38);
    }
  }
  return this;
}

Assistant:

glslopt_shader* glslopt_optimize (glslopt_ctx* ctx, glslopt_shader_type type, const char* shaderSource, unsigned options)
{
	glslopt_shader* shader = new (ctx->mem_ctx) glslopt_shader ();

	PrintGlslMode printMode = kPrintGlslVertex;
	switch (type) {
	case kGlslOptShaderVertex:
			shader->shader->Type = GL_VERTEX_SHADER;
			shader->shader->Stage = MESA_SHADER_VERTEX;
			printMode = kPrintGlslVertex;
			break;
	case kGlslOptShaderFragment:
			shader->shader->Type = GL_FRAGMENT_SHADER;
			shader->shader->Stage = MESA_SHADER_FRAGMENT;
			printMode = kPrintGlslFragment;
			break;
	}
	if (!shader->shader->Type)
	{
		shader->infoLog = ralloc_asprintf (shader, "Unknown shader type %d", (int)type);
		shader->status = false;
		return shader;
	}

	_mesa_glsl_parse_state* state = new (shader) _mesa_glsl_parse_state (&ctx->mesa_ctx, shader->shader->Stage, shader);
	state->error = 0;

	if (!(options & kGlslOptionSkipPreprocessor))
	{
		state->error = !!glcpp_preprocess (state, &shaderSource, &state->info_log, add_builtin_defines, state, &ctx->mesa_ctx);
		if (state->error)
		{
			shader->status = !state->error;
			shader->infoLog = state->info_log;
			return shader;
		}
	}

	_mesa_glsl_lexer_ctor (state, shaderSource);
	_mesa_glsl_parse (state);
	_mesa_glsl_lexer_dtor (state);

	exec_list* ir = new (shader) exec_list();
	shader->shader->ir = ir;

	if (!state->error && !state->translation_unit.is_empty())
		_mesa_ast_to_hir (ir, state);

	// Un-optimized output
	if (!state->error) {
		validate_ir_tree(ir);
		shader->rawOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	// Lower builtin functions prior to linking.
	lower_builtins(ir);

	// Link built-in functions
	shader->shader->symbols = state->symbols;
	
	struct gl_linked_shader* linked_shader = NULL;

	if (!state->error && !ir->is_empty() && !(options & kGlslOptionNotFullShader))
	{
		linked_shader = link_intrastage_shaders(shader,
												&ctx->mesa_ctx,
												shader->whole_program,
												shader->whole_program->Shaders,
												shader->whole_program->NumShaders,
												true);
		if (!linked_shader)
		{
			shader->status = false;
			shader->infoLog = shader->whole_program->data->InfoLog;
			return shader;
		}
		ir = linked_shader->ir;
		
		debug_print_ir ("==== After link ====", ir, state, shader);
	}

	// Do optimization post-link
	if (!state->error && !ir->is_empty())
	{		
		const bool linked = !(options & kGlslOptionNotFullShader);
		do_optimization_passes(ir, linked, state, shader);
		validate_ir_tree(ir);
	}	
	
	// Final optimized output
	if (!state->error)
	{
		shader->optimizedOutput = _mesa_print_ir_glsl(ir, state, ralloc_strdup(shader, ""), printMode);
	}

	shader->status = !state->error;
	shader->infoLog = state->info_log;

	find_shader_variables (shader, ir);
	// FIXME: stats
	// if (!state->error)
	// 	calculate_shader_stats (ir, &shader->statsMath, &shader->statsTex, &shader->statsFlow);

	ralloc_free (ir);
	ralloc_free (state);

	if (linked_shader)
		ralloc_free(linked_shader);

	return shader;
}